

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O0

int listbigblock(BigFile *bf,char *blockname)

{
  int iVar1;
  uint uVar2;
  uint checksum;
  uint r;
  uint s;
  uint sum;
  int i;
  BigBlock bb;
  char *blockname_local;
  BigFile *bf_local;
  
  bb._72_8_ = blockname;
  memset(&sum,0,0x50);
  iVar1 = big_file_open_block(bf,(BigBlock *)&sum,(char *)bb._72_8_);
  if (iVar1 == 0) {
    if (longfmt == 0) {
      fprintf(_stdout,"%s\n",bb._72_8_);
    }
    else {
      r = 0;
      for (s = 0; (int)s < (int)bb.fchecksum; s = s + 1) {
        r = *(int *)((long)bb.foffset + (long)(int)s * 4) + r;
      }
      uVar2 = (r & 0xffff) + (r >> 0x10);
      fprintf(_stdout,"%-28s %s %d %12td %05u %d %s\n",bb._72_8_,&sum,(ulong)(uint)bb.dtype._0_4_,
              bb.basename,(uVar2 & 0xffff) + (uVar2 >> 0x10),(int)bb.fchecksum,bb._8_8_);
    }
    big_block_close((BigBlock *)&sum);
    bf_local._4_4_ = 0;
  }
  else {
    bf_local._4_4_ = -1;
  }
  return bf_local._4_4_;
}

Assistant:

static int listbigblock(BigFile * bf, char * blockname) {
    BigBlock bb = {0};
    if(0 != big_file_open_block(bf, &bb, blockname)) {
        return -1;
    }
    if(!longfmt) {
        fprintf(stdout, "%s\n", blockname);
    } else {
        int i;
        unsigned int sum = 0;
        /* build the sysv sum from sum of each physical file */
        for(i = 0; i < bb.Nfile; i ++) {
            sum += bb.fchecksum[i];
        }
        unsigned int s = sum;
        unsigned int r = (s & 0xffff) + ((s & 0xffffffff) >> 16);
        unsigned int checksum = (r & 0xffff) + (r >> 16);
        fprintf(stdout, "%-28s %s %d %12td %05u %d %s\n", 
                blockname, 
                bb.dtype, bb.nmemb, bb.size, checksum, bb.Nfile,
                bb.basename
                );
    }
    big_block_close(&bb);
    return 0;
}